

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  XmlWriter *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long in_FS_OFFSET;
  string stylesheetRef;
  undefined1 local_a0 [24];
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  Option<Catch::TestRunInfo>::operator=
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestRunInfo.
              super_Option<Catch::TestRunInfo>,testInfo);
  (this->super_StreamingReporterBase<Catch::XmlReporter>).currentTestRunInfo.used = false;
  (*(this->super_StreamingReporterBase<Catch::XmlReporter>).super_IStreamingReporter.
    _vptr_IStreamingReporter[0x12])(&local_48,this);
  if (local_48._M_string_length != 0) {
    XmlWriter::writeStylesheetRef(&this->m_xml,&local_48);
  }
  local_68._M_allocated_capacity = (size_type)&local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Catch","");
  this_00 = &this->m_xml;
  XmlWriter::startElement(this_00,(string *)&local_68,Newline|Indent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._0_8_ != &local_58) {
    operator_delete((void *)local_68._0_8_);
  }
  (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
      super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_NonCopyable)._vptr_NonCopyable[4])(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._0_8_ != &local_58) {
    operator_delete((void *)local_68._0_8_);
  }
  if (local_68._8_8_ != 0) {
    local_68._M_allocated_capacity = (size_type)&local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"name","");
    (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
        super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_NonCopyable)._vptr_NonCopyable[4])(local_a0 + 0x18);
    XmlWriter::writeAttribute(this_00,(string *)&local_68,(string *)(local_a0 + 0x18));
    if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._0_8_ != &local_58) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xd])();
  if (*(long *)CONCAT44(extraout_var,iVar1) != ((long *)CONCAT44(extraout_var,iVar1))[1]) {
    local_68._M_allocated_capacity = (size_type)&local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"filters","");
    iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters((string *)(local_a0 + 0x18),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var_00,iVar1));
    XmlWriter::writeAttribute(this_00,(string *)&local_68,(string *)(local_a0 + 0x18));
    if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._0_8_ != &local_58) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  iVar1 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar1 != 0) {
    local_68._M_allocated_capacity = (size_type)&local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Randomness","");
    XmlWriter::scopedElement((XmlWriter *)local_a0,(string *)this_00,(XmlFormatting)&local_68);
    local_88._0_8_ = (pointer)(local_88 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x18),"seed","");
    local_a0._20_4_ =
         (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
             super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_NonCopyable)._vptr_NonCopyable[0x11])();
    XmlWriter::writeAttribute<unsigned_int>
              ((XmlWriter *)local_a0._0_8_,(string *)(local_a0 + 0x18),(uint *)(local_a0 + 0x14));
    if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._0_8_ != &local_58) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlReporter::testRunStarting( TestRunInfo const& testInfo ) {
        StreamingReporterBase::testRunStarting( testInfo );
        std::string stylesheetRef = getStylesheetRef();
        if( !stylesheetRef.empty() )
            m_xml.writeStylesheetRef( stylesheetRef );
        m_xml.startElement( "Catch" );
        if( !m_config->name().empty() )
            m_xml.writeAttribute( "name", m_config->name() );
        if (m_config->testSpec().hasFilters())
            m_xml.writeAttribute( "filters", serializeFilters( m_config->getTestsOrTags() ) );
        if( m_config->rngSeed() != 0 )
            m_xml.scopedElement( "Randomness" )
                .writeAttribute( "seed", m_config->rngSeed() );
    }